

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfutureinterface.cpp
# Opt level: O1

void __thiscall
QFutureInterfaceBasePrivate::disconnectOutputInterface
          (QFutureInterfaceBasePrivate *this,QFutureCallOutInterface *iface)

{
  QFutureCallOutInterface *pQVar1;
  long *plVar2;
  __pointer_type copy;
  long lVar3;
  QFutureCallOutInterface *pQVar4;
  QFutureCallOutInterface *pQVar5;
  bool bVar6;
  
  pQVar4 = iface;
  if ((this->m_mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p == (__pointer_type)0x0) {
    LOCK();
    bVar6 = (this->m_mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p == (__pointer_type)0x0;
    if (bVar6) {
      (this->m_mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p = (__pointer_type)0x1;
    }
    UNLOCK();
    if (!bVar6) goto LAB_003dad32;
  }
  else {
LAB_003dad32:
    QBasicMutex::lockInternal((QBasicMutex *)this);
  }
  lVar3 = (this->outputConnections).d.size;
  if (lVar3 != 0) {
    pQVar5 = (QFutureCallOutInterface *)0xfffffffffffffff8;
    do {
      pQVar1 = pQVar5 + -lVar3;
      if (pQVar1 == (QFutureCallOutInterface *)0xfffffffffffffff8) goto LAB_003dad71;
      pQVar4 = pQVar5 + 1;
      plVar2 = (long *)((long)((this->outputConnections).d.ptr + 1) + (long)pQVar5);
      pQVar5 = pQVar4;
    } while ((QFutureCallOutInterface *)*plVar2 != iface);
    pQVar4 = (QFutureCallOutInterface *)((long)pQVar4 >> 3);
LAB_003dad71:
    if (pQVar1 != (QFutureCallOutInterface *)0xfffffffffffffff8) goto LAB_003dad7e;
  }
  pQVar4 = (QFutureCallOutInterface *)0xffffffffffffffff;
LAB_003dad7e:
  if (pQVar4 != (QFutureCallOutInterface *)0xffffffffffffffff) {
    QList<QFutureCallOutInterface_*>::removeAt(&this->outputConnections,(qsizetype)pQVar4);
    (*iface->_vptr_QFutureCallOutInterface[3])(iface);
  }
  LOCK();
  copy = (this->m_mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p;
  (this->m_mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
  UNLOCK();
  if (copy != (__pointer_type)0x1) {
    QBasicMutex::unlockInternalFutex((QBasicMutex *)this,copy);
    return;
  }
  return;
}

Assistant:

void QFutureInterfaceBasePrivate::disconnectOutputInterface(QFutureCallOutInterface *iface)
{
    QMutexLocker lock(&m_mutex);
    const qsizetype index = outputConnections.indexOf(iface);
    if (index == -1)
        return;
    outputConnections.removeAt(index);

    iface->callOutInterfaceDisconnected();
}